

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

uint32_t __thiscall Buffer::CopyOut(Buffer *this,char *out,uint32_t l)

{
  BufferChain *pBVar1;
  uint16_t uVar2;
  char *__src;
  uint uVar3;
  BufferChain **ppBVar4;
  BufferChain *this_00;
  
  ppBVar4 = &this->m_head;
  uVar3 = 0;
  while( true ) {
    this_00 = *ppBVar4;
    while( true ) {
      if (this_00 == (BufferChain *)0x0) {
        return uVar3;
      }
      uVar2 = BufferChain::GetCanReadCount(this_00);
      if (uVar2 != 0) break;
      pBVar1 = this_00->nextpkt;
      (*this->_vptr_Buffer[1])(this,this_00);
      this->m_head = pBVar1;
      this_00 = pBVar1;
      if (pBVar1 == (BufferChain *)0x0) {
        this->m_end = (BufferChain *)0x0;
        this_00 = (BufferChain *)0x0;
      }
    }
    __src = BufferChain::GetReadAddr(this_00);
    if (l < uVar2) break;
    memcpy(out + uVar3,__src,(ulong)uVar2);
    uVar3 = uVar3 + uVar2;
    l = l - uVar2;
    if (l == 0) {
      return uVar3;
    }
    ppBVar4 = &this_00->nextpkt;
  }
  memcpy(out + uVar3,__src,(ulong)l);
  return uVar3 + l;
}

Assistant:

uint32_t Buffer::CopyOut(char* out, uint32_t l)
{
    uint32_t ret = 0;
    for(BufferChain* buff = m_head; buff != nullptr; )
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* tmp = buff->nextpkt;
            Cycle(buff);
            buff = tmp;
            m_head = buff;
            if(m_head == nullptr)
                m_end = nullptr;
        }
        else
        {
            if(l < canReadCount)
            {
                memcpy(out + ret, buff->GetReadAddr(), l);
                ret += l;
                return ret;
            }
            else
            {
                memcpy(out + ret, buff->GetReadAddr(), canReadCount);
                ret += canReadCount;
                l -= canReadCount;

                if(l == 0)
                    return ret;

                buff = buff->nextpkt;
            }
        }
    }
    return ret;
}